

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

wchar_t file_close2(archive_conflict *a,void *client_data)

{
  ssize_t sVar1;
  int *in_RSI;
  ssize_t bytesRead;
  read_file_data *mine;
  
  if (-1 < *in_RSI) {
    if ((((in_RSI[6] & 0xf000U) != 0x8000) && ((in_RSI[6] & 0xf000U) != 0x2000)) &&
       ((in_RSI[6] & 0xf000U) != 0x6000)) {
      do {
        sVar1 = read(*in_RSI,*(void **)(in_RSI + 4),*(size_t *)(in_RSI + 2));
      } while (0 < sVar1);
    }
    if (in_RSI[8] != 0) {
      close(*in_RSI);
    }
  }
  free(*(void **)(in_RSI + 4));
  in_RSI[4] = 0;
  in_RSI[5] = 0;
  *in_RSI = -1;
  return L'\0';
}

Assistant:

static int
file_close2(struct archive *a, void *client_data)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;

	(void)a; /* UNUSED */

	/* Only flush and close if open succeeded. */
	if (mine->fd >= 0) {
		/*
		 * Sometimes, we should flush the input before closing.
		 *   Regular files: faster to just close without flush.
		 *   Disk-like devices:  Ditto.
		 *   Tapes: must not flush (user might need to
		 *      read the "next" item on a non-rewind device).
		 *   Pipes and sockets:  must flush (otherwise, the
		 *      program feeding the pipe or socket may complain).
		 * Here, I flush everything except for regular files and
		 * device nodes.
		 */
		if (!S_ISREG(mine->st_mode)
		    && !S_ISCHR(mine->st_mode)
		    && !S_ISBLK(mine->st_mode)) {
			ssize_t bytesRead;
			do {
				bytesRead = read(mine->fd, mine->buffer,
				    mine->block_size);
			} while (bytesRead > 0);
		}
		/* If a named file was opened, then it needs to be closed. */
		if (mine->filename_type != FNT_STDIN)
			close(mine->fd);
	}
	free(mine->buffer);
	mine->buffer = NULL;
	mine->fd = -1;
	return (ARCHIVE_OK);
}